

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O0

void __thiscall BinHash<DnssecPrefixEntry>::Resize(BinHash<DnssecPrefixEntry> *this,uint newSize)

{
  DnssecPrefixEntry *pDVar1;
  ulong uVar2;
  bool local_41;
  DnssecPrefixEntry *pDStack_40;
  bool stored;
  DnssecPrefixEntry *x;
  DnssecPrefixEntry **ppDStack_30;
  uint i;
  DnssecPrefixEntry **newBins;
  DnssecPrefixEntry **ppDStack_20;
  uint32_t oldSize;
  DnssecPrefixEntry **oldBins;
  BinHash<DnssecPrefixEntry> *pBStack_10;
  uint newSize_local;
  BinHash<DnssecPrefixEntry> *this_local;
  
  ppDStack_20 = this->hashBin;
  newBins._4_4_ = this->tableSize;
  if (newBins._4_4_ < newSize) {
    uVar2 = SUB168(ZEXT416(newSize) * ZEXT816(8),0);
    if (SUB168(ZEXT416(newSize) * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    oldBins._4_4_ = newSize;
    pBStack_10 = this;
    ppDStack_30 = (DnssecPrefixEntry **)operator_new__(uVar2);
    if (ppDStack_30 != (DnssecPrefixEntry **)0x0) {
      this->hashBin = ppDStack_30;
      this->tableSize = oldBins._4_4_;
      memset(this->hashBin,0,(ulong)this->tableSize << 3);
      this->tableCount = 0;
      if (ppDStack_20 != (DnssecPrefixEntry **)0x0) {
        for (x._4_4_ = 0; x._4_4_ < newBins._4_4_; x._4_4_ = x._4_4_ + 1) {
          while (ppDStack_20[x._4_4_] != (DnssecPrefixEntry *)0x0) {
            pDStack_40 = ppDStack_20[x._4_4_];
            local_41 = false;
            ppDStack_20[x._4_4_] = pDStack_40->HashNext;
            DoInsert(this,pDStack_40,false,&local_41);
            pDVar1 = pDStack_40;
            if (((local_41 & 1U) == 0) && (pDStack_40 != (DnssecPrefixEntry *)0x0)) {
              DnssecPrefixEntry::~DnssecPrefixEntry(pDStack_40);
              operator_delete(pDVar1);
            }
          }
        }
        if (ppDStack_20 != (DnssecPrefixEntry **)0x0) {
          operator_delete__(ppDStack_20);
        }
      }
    }
  }
  return;
}

Assistant:

void Resize(unsigned newSize)
    {
        KeyObj ** oldBins = hashBin;
        uint32_t oldSize = tableSize;

        if (oldSize < newSize)
        {
            KeyObj ** newBins = new KeyObj*[newSize];

            if (newBins == NULL)
            {
                /* Cannot allocate memory. Table is unchanged. */
            }
            else
            {
                hashBin = newBins;
                tableSize = newSize;
                memset(hashBin, 0, sizeof(KeyObj *)*tableSize);
                tableCount = 0;

                if (oldBins != NULL)
                {
                    for (unsigned int i = 0; i < oldSize; i++)
                    {
                        while (oldBins[i] != NULL)
                        {
                            KeyObj* x = oldBins[i];
                            bool stored = false;

                            oldBins[i] = x->HashNext;
                            DoInsert(x, false, &stored);
                            if (!stored)
                            {
                                /* This only happens if there was a duplicate in the original table */
                                delete x;
                            }
                        }
                    }
                    
                    delete[] oldBins;
                }
            }
        }
    }